

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<unsigned_long,false>
               (char *buf,idx_t len,unsigned_long *result,bool strict)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  duckdb *pdVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int16_t local_5a;
  IntegerDecimalCastData<unsigned_long> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar4 = 0;
  do {
    bVar6 = buf[uVar4];
    if ((4 < bVar6 - 9) && (bVar6 != 0x20)) {
      if (bVar6 == 0x2d) {
        uVar12 = len - uVar4;
        uVar11 = 1;
        goto LAB_017e6cf6;
      }
      if (bVar6 == 0x30 && len - 1 != uVar4) {
        bVar16 = buf[uVar4 + 1];
        if (bVar16 < 0x62) {
          if (bVar16 == 0x42) {
LAB_017e6fb5:
            uVar11 = ~uVar4 + len;
            if (1 < uVar11) {
              uVar12 = 1;
              uVar10 = 0;
              goto LAB_017e6fd0;
            }
            break;
          }
          if (bVar16 == 0x58) {
LAB_017e6e9e:
            uVar11 = ~uVar4 + len;
            if (1 < uVar11) {
              uVar12 = 1;
              uVar10 = 0;
              goto LAB_017e6ec4;
            }
            break;
          }
        }
        else {
          if (bVar16 == 0x62) goto LAB_017e6fb5;
          if (bVar16 == 0x78) goto LAB_017e6e9e;
        }
      }
      uVar12 = len - uVar4;
      uVar11 = (ulong)(bVar6 == 0x2b);
      if (uVar11 < uVar12) {
        uVar10 = 0;
        uVar19 = uVar11;
        goto LAB_017e6d6f;
      }
      uVar10 = 0;
      uVar17 = 1;
      goto LAB_017e70cc;
    }
    uVar4 = uVar4 + 1;
  } while (len != uVar4);
  goto LAB_017e717d;
  while (lVar3 = uVar4 + uVar11, uVar11 = uVar11 + 1, buf[lVar3] == '0') {
LAB_017e6cf6:
    if (uVar12 <= uVar11) {
      if (len - 1 != uVar4) {
        uVar11 = 1;
        uVar10 = 0;
        goto LAB_017e6e05;
      }
      break;
    }
  }
  goto LAB_017e717d;
  while( true ) {
    uVar10 = uVar10 * 10 - (ulong)(byte)(bVar6 - 0x30);
    uVar19 = uVar12;
    if (~uVar11 + len == uVar4) break;
    if (buf[uVar4 + 1 + uVar11] == '_') {
      if (((len - uVar11) - 2 == uVar4) ||
         (uVar11 = uVar11 + 2, 9 < (byte)(buf[uVar4 + uVar11] - 0x30U))) goto LAB_017e717d;
    }
    else {
      uVar11 = uVar11 + 1;
    }
    uVar19 = uVar11;
    if (uVar12 <= uVar11) break;
LAB_017e6e05:
    bVar6 = buf[uVar4 + uVar11];
    if (9 < (byte)(bVar6 - 0x30)) {
      uVar17 = uVar11;
      if (bVar6 == 0x2e) {
        uVar17 = uVar11 + 1;
        uVar19 = uVar11;
        if (uVar12 <= uVar17) break;
        if ((uVar11 < 2) || (bVar6 = buf[uVar4 + 1 + uVar11], (byte)(bVar6 - 0x30) < 10))
        goto LAB_017e717d;
      }
      if ((4 < bVar6 - 9) && (bVar6 != 0x20)) goto LAB_017e717d;
      uVar17 = uVar17 + 1;
      uVar19 = uVar17;
      if (uVar17 < uVar12) goto LAB_017e7116;
      break;
    }
  }
  goto joined_r0x017e7169;
  while (uVar17 = uVar17 + 1, uVar19 = uVar12, uVar12 != uVar17) {
LAB_017e7116:
    if ((4 < (byte)buf[uVar4 + uVar17] - 9) && (buf[uVar4 + uVar17] != 0x20)) goto LAB_017e717d;
  }
joined_r0x017e7169:
  if (1 < uVar19) goto LAB_017e7142;
  goto LAB_017e717d;
  while( true ) {
    uVar17 = uVar11;
    if ((len - uVar12) - 2 != uVar4) {
      if (buf[uVar4 + 2 + uVar12] == '_') {
        if (((len - uVar12) - 3 == uVar4) || ((buf[uVar4 + 3 + uVar12] & 0xfeU) != 0x30))
        goto LAB_017e717d;
        uVar17 = uVar12 + 2;
      }
      else {
        uVar17 = uVar12 + 1;
      }
    }
    uVar12 = uVar17;
    if ((long)uVar10 < 0) goto LAB_017e717d;
    uVar10 = lVar3 + uVar10 * 2;
    if (uVar11 <= uVar12) break;
LAB_017e6fd0:
    if (buf[uVar4 + 1 + uVar12] == '0') {
      lVar3 = 0;
    }
    else {
      if (buf[uVar4 + 1 + uVar12] != '1') goto LAB_017e717d;
      lVar3 = 1;
    }
  }
  goto LAB_017e7142;
  while( true ) {
    uVar12 = uVar17;
    if (~(ulong)bVar13 >> 4 < uVar10) goto LAB_017e717d;
    uVar10 = uVar10 * 0x10 + (ulong)bVar13;
    if (uVar11 <= uVar12) break;
LAB_017e6ec4:
    bVar6 = buf[uVar4 + 1 + uVar12];
    bVar16 = bVar6 | 0x20;
    if (0x19 < (byte)(bVar6 + 0xbf)) {
      bVar16 = bVar6;
    }
    bVar6 = bVar16 - 0x30;
    if ((byte)(bVar16 + 0x9f) < 6 || bVar6 < 10) {
      bVar13 = bVar16 + 0xa9;
      if (bVar16 < 0x61) {
        bVar13 = bVar6;
      }
    }
    else {
      bVar13 = bVar6;
      if (5 < (byte)(bVar16 + 0xbf)) goto LAB_017e717d;
    }
    uVar17 = uVar11;
    if ((len - uVar12) - 2 != uVar4) {
      if (buf[uVar4 + 2 + uVar12] == '_') {
        if ((len - uVar12) - 3 == uVar4) goto LAB_017e717d;
        uVar17 = uVar12 + 2;
        if ((9 < (byte)(buf[uVar4 + 3 + uVar12] - 0x30U)) &&
           ((uVar8 = (byte)buf[uVar4 + 3 + uVar12] - 0x41, 0x25 < uVar8 ||
            ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) goto LAB_017e717d;
      }
      else {
        uVar17 = uVar12 + 1;
      }
    }
  }
  goto LAB_017e7142;
  while( true ) {
    if (~(ulong)bVar16 / 10 < uVar10) goto LAB_017e717d;
    uVar10 = (ulong)bVar16 + uVar10 * 10;
    uVar17 = uVar12;
    if (~uVar19 + len == uVar4) break;
    if (buf[uVar4 + 1 + uVar19] == '_') {
      if (((len - uVar19) - 2 == uVar4) ||
         (uVar19 = uVar19 + 2, 9 < (byte)(buf[uVar4 + uVar19] - 0x30U))) goto LAB_017e717d;
    }
    else {
      uVar19 = uVar19 + 1;
    }
    uVar17 = uVar19;
    if (uVar12 <= uVar19) break;
LAB_017e6d6f:
    bVar6 = buf[uVar4 + uVar19];
    bVar16 = bVar6 - 0x30;
    if (9 < bVar16) {
      uVar17 = uVar19;
      if (bVar6 == 0x2e) {
        uVar17 = uVar19 + 1;
        if (uVar12 <= uVar17) {
          if (uVar19 <= uVar11) goto LAB_017e717d;
          break;
        }
        if ((uVar19 <= uVar11) || (bVar6 = buf[uVar4 + 1 + uVar19], (byte)(bVar6 - 0x30) < 10))
        goto LAB_017e717d;
      }
      if ((4 < bVar6 - 9) && (bVar6 != 0x20)) goto LAB_017e717d;
      uVar19 = uVar17 + 1;
      uVar17 = uVar19;
      if (uVar19 < uVar12) goto LAB_017e70a3;
      break;
    }
  }
  goto LAB_017e70cc;
LAB_017e7634:
  uVar14 = uVar15;
  bVar6 = buf[uVar4 + uVar19];
  bVar16 = bVar6 - 0x30;
  local_40 = uVar18;
  if (9 < bVar16) {
    local_58._16_8_ = uVar14 & 0xffff;
    if (uVar19 <= uVar18 && uVar17 <= uVar12) {
      return false;
    }
LAB_017e784b:
    uVar8 = (uint)bVar6;
    if (bVar6 < 0x20) {
      if (4 < uVar8 - 9) {
        return false;
      }
LAB_017e7861:
      uVar19 = uVar19 + 1;
      uVar20 = uVar19;
      if (uVar19 < uVar11) {
        do {
          if ((4 < (byte)buf[uVar4 + uVar19] - 9) && (buf[uVar4 + uVar19] != 0x20)) {
            return false;
          }
          uVar19 = uVar19 + 1;
          uVar20 = uVar11;
        } while (uVar11 != uVar19);
      }
      goto LAB_017e76dd;
    }
    if ((bVar6 != 0x65) && (uVar8 != 0x45)) {
      if (uVar8 != 0x20) {
        return false;
      }
      goto LAB_017e7861;
    }
    if (uVar19 == uVar12) {
      return false;
    }
    if (uVar11 <= uVar19 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar9 = (duckdb *)(buf + uVar4 + uVar19 + 1);
    pcVar5 = (char *)(~uVar4 + (len - uVar19));
    if (*pdVar9 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_58,local_5a);
    goto LAB_017e75e0;
  }
  uVar15 = uVar14;
  if (local_58.decimal <= ~(ulong)bVar16 / 10) {
    uVar8 = uVar8 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar16;
    uVar15 = (ulong)uVar8;
  }
  uVar20 = uVar11;
  local_38 = uVar14;
  if (~uVar19 + len != uVar4) goto code_r0x017e7689;
  goto LAB_017e78f3;
code_r0x017e7689:
  if (buf[uVar4 + 1 + uVar19] == '_') {
    if ((len - uVar19) - 2 == uVar4) {
      return false;
    }
    uVar19 = uVar19 + 2;
    if (9 < (byte)(buf[uVar4 + uVar19] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar19 = uVar19 + 1;
  }
  uVar20 = uVar19;
  if (uVar11 <= uVar19) goto LAB_017e78f3;
  goto LAB_017e7634;
LAB_017e78f3:
  local_58._16_8_ = uVar15 & 0xffff;
LAB_017e7903:
  if ((uVar17 <= uVar12) && (uVar20 <= uVar18)) {
    return false;
  }
  goto LAB_017e76dd;
LAB_017e738f:
  bVar6 = buf[uVar4 + uVar17];
  bVar16 = bVar6 - 0x30;
  if (9 < bVar16) {
    local_58._18_6_ = 0;
    if (uVar17 <= uVar19 && uVar12 < 2) {
      return false;
    }
LAB_017e7736:
    uVar8 = (uint)bVar6;
    if (0x1f < bVar6) {
      if ((bVar6 != 0x65) && (uVar8 != 0x45)) {
        if (uVar8 != 0x20) {
          return false;
        }
        goto LAB_017e774c;
      }
      if (uVar17 == 1) {
        return false;
      }
      if (uVar11 <= uVar17 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar9 = (duckdb *)(buf + uVar4 + uVar17 + 1);
      pcVar5 = (char *)(~uVar4 + (len - uVar17));
      if (*pdVar9 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
      }
      if (bVar2 == false) {
        return false;
      }
      bVar2 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>(&local_58,local_5a)
      ;
      goto LAB_017e75e0;
    }
    if (4 < uVar8 - 9) {
      return false;
    }
LAB_017e774c:
    uVar17 = uVar17 + 1;
    uVar18 = uVar17;
    if (uVar17 < uVar11) {
      do {
        if ((4 < (byte)buf[uVar4 + uVar17] - 9) && (buf[uVar4 + uVar17] != 0x20)) {
          return false;
        }
        uVar17 = uVar17 + 1;
        uVar18 = uVar11;
      } while (uVar11 != uVar17);
    }
    goto LAB_017e77f9;
  }
  if (local_58.decimal <= ~(ulong)bVar16 / 10) {
    local_58.decimal_digits = uVar7 + 1;
    local_58.decimal = (ulong)bVar16 + local_58.decimal * 10;
    uVar7 = local_58.decimal_digits;
  }
  uVar18 = uVar11;
  if (~uVar17 + len != uVar4) goto code_r0x017e73e1;
  goto LAB_017e77df;
code_r0x017e73e1:
  if (buf[uVar4 + 1 + uVar17] == '_') {
    if ((len - uVar17) - 2 == uVar4) {
      return false;
    }
    uVar17 = uVar17 + 2;
    if (9 < (byte)(buf[uVar4 + uVar17] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar17 = uVar17 + 1;
  }
  uVar18 = uVar17;
  if (uVar11 <= uVar17) goto LAB_017e77df;
  goto LAB_017e738f;
LAB_017e77df:
  local_58._18_6_ = 0;
LAB_017e77ea:
  if ((uVar12 < 2) && (uVar18 <= uVar19)) {
    return false;
  }
  goto LAB_017e77f9;
  while (uVar19 = uVar19 + 1, uVar17 = uVar12, uVar12 != uVar19) {
LAB_017e70a3:
    if ((4 < (byte)buf[uVar4 + uVar19] - 9) && (buf[uVar4 + uVar19] != 0x20)) goto LAB_017e717d;
  }
LAB_017e70cc:
  if (uVar11 < uVar17) {
LAB_017e7142:
    *result = uVar10;
    return true;
  }
LAB_017e717d:
  uVar4 = 0;
  while ((bVar6 = buf[uVar4], bVar6 - 9 < 5 || (bVar6 == 0x20))) {
    uVar4 = uVar4 + 1;
    if (len == uVar4) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar11 = len - uVar4;
  bVar2 = SUB81(uVar11,0);
  if (bVar6 == 0x2d) {
    lVar3 = 1;
    while (uVar11 + (uVar11 == 0) != lVar3) {
      lVar1 = uVar4 + lVar3;
      lVar3 = lVar3 + 1;
      if (buf[lVar1] != '0') {
        return false;
      }
    }
    if (len - 1 == uVar4) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                (&local_58);
      return false;
    }
    bVar6 = buf[uVar4 + 1];
    uVar12 = 1;
    local_58.result = 0;
    do {
      if (9 < (byte)(bVar6 - 0x30)) {
        uVar17 = uVar12;
        if (bVar6 != 0x2e) goto LAB_017e7736;
        uVar19 = uVar12 + 1;
        uVar18 = uVar19;
        if (uVar11 <= uVar19) goto LAB_017e77ea;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar7 = 0;
        uVar17 = uVar19;
        goto LAB_017e738f;
      }
      local_58.result = local_58.result * 10 - (ulong)(byte)(bVar6 - 0x30);
      uVar18 = uVar11;
      if (~uVar12 + len == uVar4) break;
      bVar6 = buf[uVar4 + 1 + uVar12];
      if (bVar6 == 0x5f) {
        if ((len - uVar12) - 2 == uVar4) {
          return false;
        }
        uVar12 = uVar12 + 2;
        bVar6 = buf[uVar4 + uVar12];
        if (9 < (byte)(bVar6 - 0x30)) {
          return false;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar18 = uVar12;
    } while (uVar12 < uVar11);
LAB_017e77f9:
    bVar2 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>(&local_58);
    if (!bVar2) {
      return false;
    }
    if (uVar18 < 2) {
      return false;
    }
    goto LAB_017e7819;
  }
  if (bVar6 == 0x30 && len - 1 != uVar4) {
    bVar16 = buf[uVar4 + 1];
    if (bVar16 < 0x62) {
      if (bVar16 == 0x42) {
LAB_017e754b:
        uVar11 = ~uVar4 + len;
        if (uVar11 < 2) goto LAB_017e75e9;
        uVar12 = 1;
        local_58.result = 0;
        do {
          lVar3 = 0;
          if (buf[uVar4 + 1 + uVar12] != '0') {
            if (buf[uVar4 + 1 + uVar12] != '1') {
              return false;
            }
            lVar3 = 1;
          }
          uVar17 = uVar11;
          if ((len - uVar12) - 2 != uVar4) {
            if (buf[uVar4 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar4) {
                return false;
              }
              if ((buf[uVar4 + 3 + uVar12] & 0xfeU) != 0x30) {
                return false;
              }
              uVar17 = uVar12 + 2;
            }
            else {
              uVar17 = uVar12 + 1;
            }
          }
          uVar12 = uVar17;
          if ((long)local_58.result < 0) {
            return false;
          }
          local_58.result = lVar3 + local_58.result * 2;
        } while (uVar12 < uVar11);
      }
      else {
        if (bVar16 != 0x58) goto LAB_017e7220;
LAB_017e7435:
        uVar11 = ~uVar4 + len;
        if (uVar11 < 2) goto LAB_017e75e9;
        uVar12 = 1;
        local_58.result = 0;
        do {
          bVar6 = buf[uVar4 + 1 + uVar12];
          bVar16 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar16 = bVar6;
          }
          bVar6 = bVar16 - 0x30;
          if ((byte)(bVar16 + 0x9f) < 6 || bVar6 < 10) {
            bVar13 = bVar16 + 0xa9;
            if (bVar16 < 0x61) {
              bVar13 = bVar6;
            }
          }
          else {
            bVar13 = bVar6;
            if (5 < (byte)(bVar16 + 0xbf)) {
              return false;
            }
          }
          uVar17 = uVar11;
          if ((len - uVar12) - 2 != uVar4) {
            if (buf[uVar4 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar4) {
                return false;
              }
              uVar17 = uVar12 + 2;
              if (9 < (byte)(buf[uVar4 + 3 + uVar12] - 0x30U)) {
                uVar8 = (byte)buf[uVar4 + 3 + uVar12] - 0x41;
                if (0x25 < uVar8) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar17 = uVar12 + 1;
            }
          }
          uVar12 = uVar17;
          if (~(ulong)bVar13 >> 4 < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar13;
        } while (uVar12 < uVar11);
      }
      bVar2 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_58);
LAB_017e75e0:
      if (bVar2 == false) {
        return false;
      }
      goto LAB_017e7819;
    }
    if (bVar16 == 0x62) goto LAB_017e754b;
    if (bVar16 == 0x78) goto LAB_017e7435;
  }
LAB_017e7220:
  uVar12 = (ulong)(bVar6 == 0x2b);
  if (uVar11 <= uVar12) {
LAB_017e75e9:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
              (&local_58);
    return false;
  }
  local_58.result = 0;
  uVar17 = uVar12;
  do {
    bVar6 = buf[uVar4 + uVar17];
    bVar16 = bVar6 - 0x30;
    if (9 < bVar16) {
      uVar19 = uVar17;
      if (bVar6 != 0x2e) goto LAB_017e784b;
      uVar18 = uVar17 + 1;
      uVar20 = uVar18;
      if (uVar11 <= uVar18) goto LAB_017e7903;
      local_58.decimal = 0;
      uVar8 = 0;
      uVar15 = 0;
      uVar19 = uVar18;
      goto LAB_017e7634;
    }
    if (~(ulong)bVar16 / 10 < local_58.result) {
      return false;
    }
    local_58.result = (ulong)bVar16 + local_58.result * 10;
    uVar20 = uVar11;
    if (~uVar17 + len == uVar4) break;
    if (buf[uVar4 + 1 + uVar17] == '_') {
      if ((len - uVar17) - 2 == uVar4) {
        return false;
      }
      uVar17 = uVar17 + 2;
      if (9 < (byte)(buf[uVar4 + uVar17] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar17 = uVar17 + 1;
    }
    uVar20 = uVar17;
  } while (uVar17 < uVar11);
LAB_017e76dd:
  bVar2 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    (&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar20 <= uVar12) {
    return false;
  }
LAB_017e7819:
  *result = local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}